

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::testGroupStarting
          (RunContext *this,string *testSpec,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  string local_58 [32];
  size_t local_38;
  size_t local_30;
  
  pIVar1 = (this->m_reporter).m_p;
  std::__cxx11::string::string(local_58,(string *)testSpec);
  local_38 = groupIndex;
  local_30 = groupsCount;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar1,local_58);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void testGroupStarting( std::string const& testSpec, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupStarting( GroupInfo( testSpec, groupIndex, groupsCount ) );
        }